

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O2

void h264e_dpb_check(H264eDpb *dpb,EncCpbStatus *cpb)

{
  int iVar1;
  uint uVar2;
  H264eDpbFrm *pHVar3;
  char cVar4;
  ulong uVar5;
  H264eDpbFrm *pHVar6;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  uint local_5c;
  H264eDpbFrm *local_58;
  
  pHVar3 = dpb->curr;
  if ((h264e_debug._1_1_ & 1) != 0) {
    pHVar6 = dpb->refr;
    _mpp_log_l(4,"h264e_dpb","enter %p\n","h264e_dpb_check",dpb);
    if ((h264e_debug._1_1_ & 1) != 0) {
      _mpp_log_l(4,"h264e_dpb","frm %d refr -> frm %d ready\n","h264e_dpb_check",
                 (ulong)(uint)pHVar3->seq_idx,(ulong)(uint)pHVar6->seq_idx);
    }
  }
  uVar5 = (pHVar3->status).val;
  if ((uVar5 & 0x40) == 0) {
    iVar1 = dpb->used_size;
    uVar7 = dpb->dpb_size;
    if ((h264e_debug._1_1_ & 1) != 0) {
      pcVar9 = "lt";
      if (-1 < (char)uVar5) {
        pcVar9 = "st";
      }
      _mpp_log_l(4,"h264e_dpb","frm %d %s insert dpb used %d max %d\n","h264e_dpb_check",
                 (ulong)(uint)pHVar3->seq_idx,pcVar9,iVar1,uVar7);
      uVar5 = (pHVar3->status).val;
    }
    uVar10 = iVar1 + 1;
    if ((char)uVar5 < '\0') {
      iVar1 = pHVar3->lt_idx;
      dpb->lt_size = dpb->lt_size + 1;
      pHVar6 = dpb->frames;
      for (lVar8 = 0; lVar8 < dpb->total_cnt; lVar8 = lVar8 + 1) {
        if (((pHVar6 != pHVar3) && (*(char *)&pHVar6->field_2 != '\0')) &&
           (uVar5 = (pHVar6->status).val, (uVar5 & 1) != 0)) {
          if ((uVar5 & 0x40) != 0) {
            _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "!tmp->status.is_non_ref","h264e_dpb_check",0x282);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0022bdba;
            uVar5 = (pHVar6->status).val;
          }
          if (((char)uVar5 < '\0') && (pHVar6->lt_idx == iVar1)) {
            *(undefined1 *)&pHVar6->field_2 = 0;
            (pHVar6->status).val = uVar5 & 0xfffffffffffffffe;
            if ((h264e_debug._1_1_ & 1) != 0) {
              _mpp_log_l(4,"h264e_dpb","frm %d lt_idx %d replace %d\n","h264e_dpb_check",
                         (ulong)(uint)pHVar3->seq_idx,(ulong)(uint)pHVar3->lt_idx,pHVar6->slot_idx);
            }
            dpb->lt_size = dpb->lt_size + -1;
            uVar10 = uVar10 - 1;
          }
        }
        pHVar6 = pHVar6 + 1;
      }
    }
    else {
      dpb->st_size = dpb->st_size + 1;
    }
    if ((int)uVar7 < (int)uVar10) {
      if (((int)uVar7 < dpb->lt_size) &&
         (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "dpb->lt_size <= dpb_size","h264e_dpb_check",0x295),
         (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0022bdba;
      for (; (int)uVar7 < (int)uVar10; uVar10 = uVar10 - 1) {
        if ((h264e_debug._1_1_ & 1) != 0) {
          _mpp_log_l(4,"h264e_dpb","sliding window cpb proc: st %d lt %d max %d\n","h264e_dpb_check"
                     ,(ulong)(uint)dpb->st_size,(ulong)(uint)dpb->lt_size,uVar7);
        }
        local_5c = 0x7fffffff;
        local_58 = (H264eDpbFrm *)0x0;
        pHVar6 = dpb->frames;
        for (lVar8 = 0; lVar8 < dpb->total_cnt; lVar8 = lVar8 + 1) {
          if ((h264e_debug._1_1_ & 1) != 0) {
            _mpp_log_l(4,"h264e_dpb","frm %d num %d poc %d\n","h264e_dpb_check",
                       (ulong)(uint)pHVar6->seq_idx,(ulong)(uint)pHVar6->frame_num,pHVar6->poc);
          }
          if ((pHVar6->as_pskip_ref == 0) && ((pHVar6->field_2).on_used != 0)) {
            uVar5 = (pHVar6->status).val;
            cVar4 = (char)uVar5;
            if ((uVar5 & 1) != 0) {
              if ((uVar5 & 0x40) != 0) {
                _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "!tmp->status.is_non_ref","h264e_dpb_check",0x2ad);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0022bdba;
                cVar4 = (char)(pHVar6->status).val;
              }
              if (((-1 < cVar4) && (uVar2 = pHVar6->poc, (int)uVar2 < (int)local_5c)) &&
                 (local_5c = uVar2, local_58 = pHVar6, (h264e_debug._1_1_ & 1) != 0)) {
                _mpp_log_l(4,"h264e_dpb","frm %d update smallest poc to %d\n","h264e_dpb_check",
                           (ulong)(uint)pHVar6->seq_idx,(ulong)uVar2);
              }
            }
          }
          pHVar6 = pHVar6 + 1;
        }
        if (local_58 == (H264eDpbFrm *)0x0) goto LAB_0022bc21;
        if ((h264e_debug._1_1_ & 1) != 0) {
          _mpp_log_l(4,"h264e_dpb","removing frm %d poc %d\n","h264e_dpb_check",
                     (ulong)(uint)local_58->seq_idx,(ulong)(uint)local_58->poc);
        }
        *(undefined1 *)&local_58->field_2 = 0;
        iVar1 = dpb->st_size;
        dpb->st_size = iVar1 + -1;
        if ((iVar1 < 1) &&
           (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "dpb->st_size >= 0","h264e_dpb_check",0x2c1), (mpp_debug._3_1_ & 0x10) != 0))
        goto LAB_0022bdba;
      }
      dpb->used_size = uVar7;
    }
    else {
LAB_0022bc21:
      dpb->used_size = uVar10;
      if ((int)uVar7 < (int)uVar10) {
        _mpp_log_l(2,"h264e_dpb","error found used_size %d > dpb_size %d\n","h264e_dpb_check",
                   (ulong)uVar10,(ulong)uVar7);
        _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "used_size <= dpb_size","h264e_dpb_check",0x2cb);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0022bdba;
      }
    }
  }
  else {
    *(undefined1 *)&pHVar3->field_2 = 0;
    (pHVar3->status).val = uVar5 & 0xfffffffffffffffe;
  }
  if ((h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","curr %d done used_size %d\n","h264e_dpb_check",
               (ulong)(uint)pHVar3->seq_idx,(ulong)(uint)dpb->used_size);
  }
  uVar7 = 0;
  for (lVar8 = 0; lVar8 != 0x40; lVar8 = lVar8 + 8) {
    pHVar6 = find_cpb_frame(dpb,(EncFrmStatus *)((long)cpb->final + lVar8));
    *(H264eDpbFrm **)((long)dpb->map + lVar8) = pHVar6;
    uVar7 = (uVar7 + 1) - (uint)(pHVar6 == (H264eDpbFrm *)0x0);
  }
  if ((h264e_debug._1_1_ & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","curr %d cpb final used_size %d vs %d\n","h264e_dpb_check",
               (ulong)(uint)pHVar3->seq_idx,(ulong)uVar7,dpb->used_size);
  }
  if ((dpb->used_size == uVar7) ||
     (_mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "dpb->used_size == used_size","h264e_dpb_check",0x2da),
     (mpp_debug._3_1_ & 0x10) == 0)) {
    if ((h264e_debug._1_1_ & 1) != 0) {
      _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_check",dpb);
      return;
    }
    return;
  }
LAB_0022bdba:
  abort();
}

Assistant:

void h264e_dpb_check(H264eDpb *dpb, EncCpbStatus *cpb)
{
    H264eDpbFrm *curr = dpb->curr;
    H264eDpbFrm *refr = dpb->refr;
    RK_S32 i;

    h264e_dbg_dpb("enter %p\n", dpb);

    h264e_dbg_dpb("frm %d refr -> frm %d ready\n",
                  curr->seq_idx, refr->seq_idx);

    if (curr->status.is_non_ref) {
        curr->dpb_used = 0;
        curr->status.valid = 0;
    } else {
        /* sliding window process */
        RK_S32 used_size = dpb->used_size;
        RK_S32 dpb_size = dpb->dpb_size;

        h264e_dbg_dpb("frm %d %s insert dpb used %d max %d\n",
                      curr->seq_idx, curr->status.is_lt_ref ? "lt" : "st",
                      used_size, dpb_size);

        used_size++;

        /* replace lt ref with same lt_idx */
        if (curr->status.is_lt_ref) {
            RK_S32 lt_idx = curr->lt_idx;

            dpb->lt_size++;

            for (i = 0; i < dpb->total_cnt; i++) {
                H264eDpbFrm *tmp = &dpb->frames[i];

                if (tmp == curr)
                    continue;

                if (!tmp->dpb_used)
                    continue;

                if (!tmp->status.valid)
                    continue;

                mpp_assert(!tmp->status.is_non_ref);

                if (!tmp->status.is_lt_ref)
                    continue;

                if (tmp->lt_idx == lt_idx) {
                    tmp->dpb_used = 0;
                    tmp->status.valid = 0;
                    h264e_dbg_dpb("frm %d lt_idx %d replace %d\n",
                                  curr->seq_idx, curr->lt_idx, tmp->slot_idx);
                    dpb->lt_size--;
                    used_size--;
                }
            }
        } else {
            dpb->st_size++;
        }

        if (used_size > dpb_size) {
            mpp_assert(dpb->lt_size <= dpb_size);

            while (used_size > dpb_size) {
                RK_S32 small_poc = 0x7fffffff;
                H264eDpbFrm *unref = NULL;

                h264e_dbg_dpb("sliding window cpb proc: st %d lt %d max %d\n",
                              dpb->st_size, dpb->lt_size, dpb_size);

                for (i = 0; i < dpb->total_cnt; i++) {
                    H264eDpbFrm *tmp = &dpb->frames[i];

                    h264e_dbg_dpb("frm %d num %d poc %d\n",
                                  tmp->seq_idx, tmp->frame_num, tmp->poc);

                    if (tmp->as_pskip_ref)
                        continue;

                    if (!tmp->on_used)
                        continue;

                    if (!tmp->status.valid)
                        continue;

                    mpp_assert(!tmp->status.is_non_ref);

                    if (tmp->status.is_lt_ref)
                        continue;

                    if (tmp->poc < small_poc) {
                        unref = tmp;
                        small_poc = tmp->poc;

                        h264e_dbg_dpb("frm %d update smallest poc to %d\n",
                                      tmp->seq_idx, tmp->poc);
                    }
                }

                if (unref) {
                    h264e_dbg_dpb("removing frm %d poc %d\n",
                                  unref->seq_idx, unref->poc);

                    unref->dpb_used = 0;
                    dpb->st_size--;
                    mpp_assert(dpb->st_size >= 0);
                    used_size--;
                } else
                    break;
            }
        }

        dpb->used_size = used_size;
        if (used_size > dpb_size) {
            mpp_err_f("error found used_size %d > dpb_size %d\n", used_size, dpb_size);
            mpp_assert(used_size <= dpb_size);
        }
    }

    h264e_dbg_dpb("curr %d done used_size %d\n", curr->seq_idx, dpb->used_size);

    RK_S32 used_size = 0;
    for (i = 0; i < MAX_CPB_REFS; i++) {
        dpb->map[i] = find_cpb_frame(dpb, &cpb->final[i]);
        if (dpb->map[i])
            used_size++;
    }

    h264e_dbg_dpb("curr %d cpb final used_size %d vs %d\n",
                  curr->seq_idx, used_size, dpb->used_size);
    mpp_assert(dpb->used_size == used_size);

    h264e_dbg_dpb("leave %p\n", dpb);
}